

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.cpp
# Opt level: O3

int diff(int argc,char **argv)

{
  vector<DiffLine,_std::allocator<DiffLine>_> diff_lines;
  string old_dir;
  string new_dir;
  vector<FileStatus,_std::allocator<FileStatus>_> status;
  string local_188;
  string local_168;
  string local_148;
  vector<DiffLine,_std::allocator<DiffLine>_> local_128;
  vector<FileStatus,_std::allocator<FileStatus>_> local_110;
  vector<FileStatus,_std::allocator<FileStatus>_> local_f8;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if (1 < argc) {
    std::__cxx11::string::string((string *)&local_40,*argv,(allocator *)&local_168);
    hashToDir(&local_148,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    std::__cxx11::string::string((string *)&local_60,argv[1],(allocator *)&local_188);
    hashToDir(&local_168,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (argc == 2) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_148._M_dataplus._M_p,
                 local_148._M_dataplus._M_p + local_148._M_string_length);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,local_168._M_dataplus._M_p,
                 local_168._M_dataplus._M_p + local_168._M_string_length);
      diffStatus(&local_f8,&local_80,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      std::vector<FileStatus,_std::allocator<FileStatus>_>::vector(&local_110,&local_f8);
      strStatus_abi_cxx11_(&local_188,&local_110);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_188._M_dataplus._M_p,local_188._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      std::vector<FileStatus,_std::allocator<FileStatus>_>::~vector(&local_110);
      std::vector<FileStatus,_std::allocator<FileStatus>_>::~vector(&local_f8);
    }
    else {
      std::__cxx11::string::append((char *)&local_148);
      std::__cxx11::string::append((char *)&local_148);
      std::__cxx11::string::append((char *)&local_168);
      std::__cxx11::string::append((char *)&local_168);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,local_148._M_dataplus._M_p,
                 local_148._M_dataplus._M_p + local_148._M_string_length);
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,local_168._M_dataplus._M_p,
                 local_168._M_dataplus._M_p + local_168._M_string_length);
      diff_files((vector<DiffLine,_std::allocator<DiffLine>_> *)&local_188,&local_c0,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      std::vector<DiffLine,_std::allocator<DiffLine>_>::vector
                (&local_128,(vector<DiffLine,_std::allocator<DiffLine>_> *)&local_188);
      printDiffLines(&local_128);
      std::vector<DiffLine,_std::allocator<DiffLine>_>::~vector(&local_128);
      std::vector<DiffLine,_std::allocator<DiffLine>_>::~vector
                ((vector<DiffLine,_std::allocator<DiffLine>_> *)&local_188);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    return 0;
  }
  puts("diff need 2 or more arguments");
  exit(1);
}

Assistant:

int diff(int argc, char *argv[]){
    if(argc < 2){
        printf("diff need 2 or more arguments\n");
        exit(EXIT_FAILURE);
    }
    String new_dir = hashToDir(argv[0]);
    String old_dir = hashToDir(argv[1]);
    if (argc < 3){
        Vector<FileStatus> status = diffStatus(new_dir, old_dir);
        Cout << strStatus(status);
    } else{
        new_dir += "/";
        new_dir += argv[2];
        old_dir += "/";
        old_dir += argv[2];
        Vector<DiffLine> diff_lines = diff_files(new_dir,old_dir);
        printDiffLines(diff_lines);
    }
    return 0;
}